

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggx.cpp
# Opt level: O3

vec3 __thiscall ggx::sample(ggx *this,vec3 *view_dir,vec2 *random_parameters)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  vec3 vVar8;
  
  fVar1 = (random_parameters->field_0).field_0.y;
  fVar3 = (random_parameters->field_0).field_0.x * 6.2831855;
  fVar4 = this->_alpha;
  fVar1 = fVar1 / (1.0 - fVar1);
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar4 = fVar4 * fVar1;
  fVar2 = cosf(fVar3);
  fVar3 = sinf(fVar3);
  fVar1 = (view_dir->field_0).field_0.z;
  fVar2 = fVar2 * fVar4;
  fVar3 = fVar3 * fVar4;
  fVar7 = 1.0 / SQRT(fVar3 * fVar3 + fVar2 * fVar2 + 1.0);
  fVar5 = (float)*(undefined8 *)&view_dir->field_0;
  fVar4 = -(float)((ulong)*(undefined8 *)&view_dir->field_0 >> 0x20);
  fVar6 = (fVar7 * fVar3 * fVar4 - fVar5 * fVar7 * fVar2) - fVar1 * fVar7;
  fVar2 = fVar6 * fVar7 * fVar2;
  fVar3 = fVar6 * fVar7 * fVar3;
  vVar8.field_0._0_4_ = -fVar5 - (fVar2 + fVar2);
  vVar8.field_0._4_4_ = fVar4 - (fVar3 + fVar3);
  vVar8.field_0._8_4_ = -fVar1 - (fVar7 * fVar6 + fVar7 * fVar6);
  return (vec3)vVar8.field_0;
}

Assistant:

glm::vec3 ggx::sample(const glm::vec3 &view_dir, const glm::vec2 &random_parameters) const
{
  float u1 = random_parameters.x;
  float u2 = random_parameters.y;

  // This is classic GGX sampling, it is rewritten to solve for X-axis side of right triangle. For simplicity,
  // we assume that other side is equal to 1. Hypotenuse is equal to sqrt(r^2+1). In that case:
  //   cos(theta) = (1) / sqrt(r^2+1)
  // Now we can transform standard GGX sampling method by comparing that cos(theta) and cos(theta) defined by
  // sampling method. In the end we get:
  //   r = alpha * sqrt(u/(1-u))

  const float phi = 2.0f * pi * u1;
  const float r = _alpha * sqrtf(u2/(1.0f - u2));

  const glm::vec3 h = glm::normalize(glm::vec3(r*cosf(phi), r*sinf(phi), 1.0f));
  const glm::vec3 l = glm::reflect(-view_dir, h);

  return l;
}